

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

uint reed_solomon_find_error_locator(correct_reed_solomon *rs,size_t num_erasures)

{
  field_logarithm_t *pfVar1;
  field_element_t *pfVar2;
  field_element_t *pfVar3;
  bool bVar4;
  uint i;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  field_element_t fVar19;
  ulong uVar20;
  
  uVar7 = 0;
  memset((rs->error_locator).coeff,0,rs->min_distance + 1);
  *(rs->error_locator).coeff = '\x01';
  (rs->error_locator).order = 0;
  memcpy((rs->last_error_locator).coeff,(rs->error_locator).coeff,rs->min_distance + 1);
  uVar17 = (rs->error_locator).order;
  uVar13 = (ulong)uVar17;
  (rs->last_error_locator).order = uVar17;
  if (uVar13 < rs->min_distance - num_erasures) {
    uVar17 = uVar17 - 1;
    iVar10 = 1;
    bVar12 = 1;
    do {
      bVar14 = rs->syndromes[uVar13];
      if (uVar7 != 0) {
        uVar16 = 1;
        uVar18 = uVar17;
        do {
          uVar20 = (ulong)(rs->error_locator).coeff[uVar16];
          bVar5 = 0;
          if ((uVar20 != 0) && (bVar11 = rs->syndromes[uVar18], bVar11 != 0)) {
            pfVar1 = (rs->field).log;
            bVar5 = (rs->field).exp[(ulong)pfVar1[bVar11] + (ulong)pfVar1[uVar20]];
          }
          bVar14 = bVar14 ^ bVar5;
          uVar15 = (int)uVar16 + 1;
          uVar16 = (ulong)uVar15;
          uVar18 = uVar18 - 1;
        } while (uVar15 <= uVar7);
      }
      uVar18 = (uint)uVar13;
      if (bVar14 == 0) {
LAB_001084e5:
        iVar10 = iVar10 + 1;
        bVar14 = bVar12;
      }
      else {
        uVar15 = (rs->last_error_locator).order;
        if (uVar18 < uVar7 * 2) {
          if (-1 < (int)uVar15) {
            uVar13 = (ulong)uVar15;
            do {
              uVar16 = (ulong)(rs->last_error_locator).coeff[uVar13];
              pfVar2 = (rs->field).exp;
              pfVar1 = (rs->field).log;
              if (uVar16 == 0) {
                bVar5 = 0;
              }
              else {
                bVar5 = pfVar2[(ulong)pfVar1[bVar14] + (ulong)pfVar1[uVar16]];
              }
              bVar11 = 0;
              if ((bVar12 != 0) && (bVar11 = 0, bVar5 != 0)) {
                bVar11 = pfVar2[((ulong)pfVar1[bVar5] - (ulong)pfVar1[bVar12]) + 0xff];
              }
              pfVar2 = (rs->error_locator).coeff;
              uVar15 = iVar10 + (int)uVar13;
              pfVar2[uVar15] = bVar11 ^ pfVar2[uVar15];
              bVar4 = 0 < (long)uVar13;
              uVar13 = uVar13 - 1;
            } while (bVar4);
          }
          uVar6 = (rs->last_error_locator).order + iVar10;
          uVar15 = (rs->error_locator).order;
          if (uVar6 <= uVar15) {
            uVar6 = uVar15;
          }
          (rs->error_locator).order = uVar6;
          goto LAB_001084e5;
        }
        if (-1 < (int)uVar15) {
          uVar13 = (ulong)uVar15;
          do {
            pfVar2 = (rs->last_error_locator).coeff;
            uVar16 = (ulong)pfVar2[uVar13];
            pfVar3 = (rs->field).exp;
            pfVar1 = (rs->field).log;
            if (uVar16 == 0) {
              bVar5 = 0;
            }
            else {
              bVar5 = pfVar3[(ulong)pfVar1[bVar14] + (ulong)pfVar1[uVar16]];
            }
            fVar19 = '\0';
            if ((bVar12 != 0) && (bVar5 != 0)) {
              fVar19 = pfVar3[((ulong)pfVar1[bVar5] - (ulong)pfVar1[bVar12]) + 0xff];
            }
            pfVar2[(uint)(iVar10 + (int)uVar13)] = fVar19;
            bVar4 = 0 < (long)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar4);
        }
        if (-1 < (int)(iVar10 - 1U)) {
          lVar8 = (ulong)(iVar10 - 1U) + 1;
          do {
            (rs->last_error_locator).coeff[lVar8 + -1] = '\0';
            lVar9 = lVar8 + -1;
            bVar4 = 0 < lVar8;
            lVar8 = lVar9;
          } while (lVar9 != 0 && bVar4);
        }
        uVar13 = 0xffffffffffffffff;
        do {
          pfVar2 = (rs->error_locator).coeff;
          bVar12 = pfVar2[uVar13 + 1];
          pfVar2[uVar13 + 1] = (rs->last_error_locator).coeff[uVar13 + 1] ^ bVar12;
          (rs->last_error_locator).coeff[uVar13 + 1] = bVar12;
          uVar15 = (rs->last_error_locator).order + iVar10;
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar15);
        uVar6 = (rs->error_locator).order;
        (rs->error_locator).order = uVar15;
        (rs->last_error_locator).order = uVar6;
        uVar7 = (uVar18 - uVar7) + 1;
        iVar10 = 1;
      }
      uVar13 = (ulong)(uVar18 + 1);
      uVar17 = uVar17 + 1;
      bVar12 = bVar14;
    } while (uVar13 < rs->min_distance - num_erasures);
  }
  return (rs->error_locator).order;
}

Assistant:

static unsigned int reed_solomon_find_error_locator(correct_reed_solomon *rs, size_t num_erasures) {
    unsigned int numerrors = 0;

    memset(rs->error_locator.coeff, 0, (rs->min_distance + 1) * sizeof(field_element_t));

    // initialize to f(x) = 1
    rs->error_locator.coeff[0] = 1;
    rs->error_locator.order = 0;

    memcpy(rs->last_error_locator.coeff, rs->error_locator.coeff, (rs->min_distance + 1) * sizeof(field_element_t));
    rs->last_error_locator.order = rs->error_locator.order;

    field_element_t discrepancy;
    field_element_t last_discrepancy = 1;
    unsigned int delay_length = 1;

    for (unsigned int i = rs->error_locator.order; i < rs->min_distance - num_erasures; i++) {
        discrepancy = rs->syndromes[i];
        for (unsigned int j = 1; j <= numerrors; j++) {
            discrepancy = field_add(rs->field, discrepancy,
                                    field_mul(rs->field, rs->error_locator.coeff[j], rs->syndromes[i - j]));
        }

        if (!discrepancy) {
            // our existing LFSR describes the new syndrome as well
            // leave it as-is but update the number of delay elements
            //   so that if a discrepancy occurs later we can eliminate it
            delay_length++;
            continue;
        }

        if (2 * numerrors <= i) {
            // there's a discrepancy, but we still have room for more taps
            // lengthen LFSR by one tap and set weight to eliminate discrepancy

            // shift the last locator by the delay length, multiply by discrepancy,
            //   and divide by the last discrepancy
            // we move down because we're shifting up, and this prevents overwriting
            for (int j = rs->last_error_locator.order; j >= 0; j--) {
                // the bounds here will be ok since we have a headroom of numerrors
                rs->last_error_locator.coeff[j + delay_length] = field_div(
                    rs->field, field_mul(rs->field, rs->last_error_locator.coeff[j], discrepancy), last_discrepancy);
            }
            for (int j = delay_length - 1; j >= 0; j--) {
                rs->last_error_locator.coeff[j] = 0;
            }

            // locator = locator - last_locator
            // we will also update last_locator to be locator before this loop takes place
            field_element_t temp;
            for (int j = 0; j <= (rs->last_error_locator.order + delay_length); j++) {
                temp = rs->error_locator.coeff[j];
                rs->error_locator.coeff[j] =
                    field_add(rs->field, rs->error_locator.coeff[j], rs->last_error_locator.coeff[j]);
                rs->last_error_locator.coeff[j] = temp;
            }
            unsigned int temp_order = rs->error_locator.order;
            rs->error_locator.order = rs->last_error_locator.order + delay_length;
            rs->last_error_locator.order = temp_order;

            // now last_locator is locator before we started,
            //   and locator is (locator - (discrepancy/last_discrepancy) * x^(delay_length) * last_locator)

            numerrors = i + 1 - numerrors;
            last_discrepancy = discrepancy;
            delay_length = 1;
            continue;
        }

        // no more taps
        // unlike the previous case, we are preserving last locator,
        //    but we'll update locator as before
        // we're basically flattening the two loops from the previous case because
        //    we no longer need to update last_locator
        for (int j = rs->last_error_locator.order; j >= 0; j--) {
            rs->error_locator.coeff[j + delay_length] =
                field_add(rs->field, rs->error_locator.coeff[j + delay_length],
                          field_div(rs->field, field_mul(rs->field, rs->last_error_locator.coeff[j], discrepancy),
                                    last_discrepancy));
        }
        rs->error_locator.order = (rs->last_error_locator.order + delay_length > rs->error_locator.order)
                                      ? rs->last_error_locator.order + delay_length
                                      : rs->error_locator.order;
        delay_length++;
    }
    return rs->error_locator.order;
}